

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O2

int mbedtls_md_file(mbedtls_md_info_t *md_info,char *path,uchar *output)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  void *pvVar3;
  size_t sVar4;
  mbedtls_md_context_t ctx;
  uchar buf [1024];
  
  if (md_info == (mbedtls_md_info_t *)0x0) {
    iVar1 = -0x5100;
  }
  else {
    __stream = fopen(path,"rb");
    if (__stream == (FILE *)0x0) {
      iVar1 = -0x5200;
    }
    else {
      ctx.md_info = (mbedtls_md_info_t *)0x0;
      ctx.md_ctx = (void *)0x0;
      ctx.hmac_ctx = (void *)0x0;
      pvVar3 = (*md_info->ctx_alloc_func)();
      ctx.md_ctx = pvVar3;
      if (pvVar3 == (void *)0x0) {
        iVar1 = -0x5180;
      }
      else {
        ctx.md_info = md_info;
        iVar1 = (*md_info->starts_func)(pvVar3);
        if (iVar1 == 0) {
          do {
            sVar4 = fread(buf,1,0x400,__stream);
            if (sVar4 == 0) {
              iVar2 = ferror(__stream);
              iVar1 = -0x5200;
              if (iVar2 == 0) {
                iVar1 = (*md_info->finish_func)(pvVar3,output);
              }
              break;
            }
            iVar1 = (*md_info->update_func)(pvVar3,buf,sVar4);
          } while (iVar1 == 0);
        }
      }
      mbedtls_zeroize(buf,0x400);
      fclose(__stream);
      mbedtls_md_free(&ctx);
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_md_file( const mbedtls_md_info_t *md_info, const char *path, unsigned char *output )
{
    int ret;
    FILE *f;
    size_t n;
    mbedtls_md_context_t ctx;
    unsigned char buf[1024];

    if( md_info == NULL )
        return( MBEDTLS_ERR_MD_BAD_INPUT_DATA );

    if( ( f = fopen( path, "rb" ) ) == NULL )
        return( MBEDTLS_ERR_MD_FILE_IO_ERROR );

    mbedtls_md_init( &ctx );

    if( ( ret = mbedtls_md_setup( &ctx, md_info, 0 ) ) != 0 )
        goto cleanup;

    if( ( ret = md_info->starts_func( ctx.md_ctx ) ) != 0 )
        goto cleanup;

    while( ( n = fread( buf, 1, sizeof( buf ), f ) ) > 0 )
        if( ( ret = md_info->update_func( ctx.md_ctx, buf, n ) ) != 0 )
            goto cleanup;

    if( ferror( f ) != 0 )
        ret = MBEDTLS_ERR_MD_FILE_IO_ERROR;
    else
        ret = md_info->finish_func( ctx.md_ctx, output );

cleanup:
    mbedtls_zeroize( buf, sizeof( buf ) );
    fclose( f );
    mbedtls_md_free( &ctx );

    return( ret );
}